

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_grid.c
# Opt level: O0

REF_STATUS
ref_grid_tri_qua_id_nodes
          (REF_GRID ref_grid,REF_INT cell_id,REF_INT *nnode,REF_INT *ncell,REF_INT **g2l,
          REF_INT **l2g)

{
  REF_NODE pRVar1;
  REF_CELL pRVar2;
  REF_STATUS RVar3;
  REF_INT *pRVar4;
  int local_cc;
  REF_INT local_c8;
  REF_INT ref_malloc_init_i;
  REF_INT nodes [27];
  REF_INT cell_node;
  REF_INT node;
  REF_INT cell;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT **l2g_local;
  REF_INT **g2l_local;
  REF_INT *ncell_local;
  REF_INT *nnode_local;
  REF_INT cell_id_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  if (pRVar1->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x18a,
           "ref_grid_tri_qua_id_nodes","malloc *g2l of REF_INT negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    pRVar4 = (REF_INT *)malloc((long)pRVar1->max << 2);
    *g2l = pRVar4;
    if (*g2l == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",0x18a,
             "ref_grid_tri_qua_id_nodes","malloc *g2l of REF_INT NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (local_cc = 0; local_cc < pRVar1->max; local_cc = local_cc + 1) {
        (*g2l)[local_cc] = -1;
      }
      *nnode = 0;
      *ncell = 0;
      pRVar2 = ref_grid->cell[3];
      for (cell_node = 0; cell_node < pRVar2->max; cell_node = cell_node + 1) {
        RVar3 = ref_cell_nodes(pRVar2,cell_node,&local_c8);
        if ((RVar3 == 0) && (cell_id == (&local_c8)[pRVar2->node_per])) {
          *ncell = *ncell + 1;
          for (nodes[0x19] = 0; nodes[0x19] < pRVar2->node_per; nodes[0x19] = nodes[0x19] + 1) {
            if ((*g2l)[(&local_c8)[nodes[0x19]]] == -1) {
              (*g2l)[(&local_c8)[nodes[0x19]]] = *nnode;
              *nnode = *nnode + 1;
            }
          }
        }
      }
      pRVar2 = ref_grid->cell[6];
      for (cell_node = 0; cell_node < pRVar2->max; cell_node = cell_node + 1) {
        RVar3 = ref_cell_nodes(pRVar2,cell_node,&local_c8);
        if ((RVar3 == 0) && (cell_id == (&local_c8)[pRVar2->node_per])) {
          *ncell = *ncell + 1;
          for (nodes[0x19] = 0; nodes[0x19] < pRVar2->node_per; nodes[0x19] = nodes[0x19] + 1) {
            if ((*g2l)[(&local_c8)[nodes[0x19]]] == -1) {
              (*g2l)[(&local_c8)[nodes[0x19]]] = *nnode;
              *nnode = *nnode + 1;
            }
          }
        }
      }
      if (*nnode < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
               0x1a9,"ref_grid_tri_qua_id_nodes","malloc *l2g of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        pRVar4 = (REF_INT *)malloc((long)*nnode << 2);
        *l2g = pRVar4;
        if (*l2g == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_grid.c",
                 0x1a9,"ref_grid_tri_qua_id_nodes","malloc *l2g of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          *nnode = 0;
          for (nodes[0x1a] = 0; nodes[0x1a] < pRVar1->max; nodes[0x1a] = nodes[0x1a] + 1) {
            if ((*g2l)[nodes[0x1a]] != -1) {
              (*g2l)[nodes[0x1a]] = *nnode;
              (*l2g)[*nnode] = nodes[0x1a];
              *nnode = *nnode + 1;
            }
          }
          ref_grid_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_grid_tri_qua_id_nodes(REF_GRID ref_grid, REF_INT cell_id,
                                             REF_INT *nnode, REF_INT *ncell,
                                             REF_INT **g2l, REF_INT **l2g) {
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_INT cell, node, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  ref_node = ref_grid_node(ref_grid);

  ref_malloc_init(*g2l, ref_node_max(ref_node), REF_INT, REF_EMPTY);

  (*nnode) = 0;
  (*ncell) = 0;

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (cell_id == nodes[ref_cell_id_index(ref_cell)]) {
      (*ncell)++;
      each_ref_cell_cell_node(ref_cell, cell_node) {
        if (REF_EMPTY == (*g2l)[nodes[cell_node]]) {
          (*g2l)[nodes[cell_node]] = (*nnode);
          (*nnode)++;
        }
      }
    }
  }

  ref_malloc(*l2g, *nnode, REF_INT);

  (*nnode) = 0;
  for (node = 0; node < ref_node_max(ref_node); node++) {
    if (REF_EMPTY != (*g2l)[node]) {
      (*g2l)[node] = (*nnode);
      (*l2g)[(*nnode)] = node;
      (*nnode)++;
    }
  }

  return REF_SUCCESS;
}